

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surveyor.c
# Opt level: O0

int nn_surveyor_setopt(nn_sockbase *self,int level,int option,void *optval,size_t optvallen)

{
  nn_sockbase *local_38;
  nn_surveyor *surveyor;
  size_t optvallen_local;
  void *optval_local;
  int option_local;
  int level_local;
  nn_sockbase *self_local;
  int local_4;
  
  local_38 = self;
  if (self == (nn_sockbase *)0x0) {
    local_38 = (nn_sockbase *)0x0;
  }
  if (level == 0x62) {
    if (option == 1) {
      if (optvallen == 4) {
        *(undefined4 *)&local_38[0x35].sock = *optval;
        local_4 = 0;
      }
      else {
        local_4 = -0x16;
      }
    }
    else {
      local_4 = -0x5c;
    }
  }
  else {
    local_4 = -0x5c;
  }
  return local_4;
}

Assistant:

static int nn_surveyor_setopt (struct nn_sockbase *self, int level, int option,
    const void *optval, size_t optvallen)
{
    struct nn_surveyor *surveyor;

    surveyor = nn_cont (self, struct nn_surveyor, xsurveyor.sockbase);

    if (level != NN_SURVEYOR)
        return -ENOPROTOOPT;

    if (option == NN_SURVEYOR_DEADLINE) {
        if (nn_slow (optvallen != sizeof (int)))
            return -EINVAL;
        surveyor->deadline = *(int*) optval;
        return 0;
    }

    return -ENOPROTOOPT;
}